

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat * __thiscall Mat::operator&(Mat *__return_storage_ptr__,Mat *this,int b)

{
  pointer p_Var1;
  pointer p_Var2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  Mat(__return_storage_ptr__,this->r,this->c);
  uVar4 = this->c * this->r;
  p_Var1 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var2 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 * 0x10 != uVar6; uVar6 = uVar6 + 0x10) {
    uVar3 = *(ulong *)((long)p_Var1 + uVar6 + 8);
    *(ulong *)((long)p_Var2 + uVar6) = *(ulong *)((long)p_Var1 + uVar6) & (long)b;
    *(ulong *)((long)p_Var2 + uVar6 + 8) = uVar3 & (long)b >> 0x3f;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::operator&(int b) const {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = val[i] & b;
    }
    return ret;
}